

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteStackVarDeclarations(CWriter *this)

{
  anon_class_8_1_8991fb9c local_20;
  anon_class_1_0_00000001 local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_20.this = this;
  local_10 = this;
  (anonymous_namespace)::CWriter::
  WriteVarsByType<std::map<std::pair<unsigned_int,wabt::Type>,std::__cxx11::string,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>,wabt::(anonymous_namespace)::CWriter::WriteStackVarDeclarations()::__0,wabt::(anonymous_namespace)::CWriter::WriteStackVarDeclarations()::__1>
            ((CWriter *)this,&this->stack_var_sym_map_,&local_11,&local_20,false);
  return;
}

Assistant:

void CWriter::WriteStackVarDeclarations() {
  // NOTE: setjmp_safe must be false, can't push func sections in here because
  // this is called from FinishFunction.
  // (luckily, we don't need setjmp_safe for these.)
  WriteVarsByType(
      stack_var_sym_map_, [](auto stp_name) { return stp_name.first.second; },
      [&](Index, auto& stp_name) { Write(stp_name.second); }, false);
}